

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

string * __thiscall
FBX::Decoder::readString_abi_cxx11_(string *__return_storage_ptr__,Decoder *this)

{
  undefined1 __beg [8];
  char *__end;
  byte bVar1;
  allocator<char> local_31;
  undefined1 local_30 [8];
  Span<char> data;
  size_t size;
  Decoder *this_local;
  
  bVar1 = Stream::read<unsigned_char>(&this->stream);
  data.end = (char *)(ulong)bVar1;
  _local_30 = Stream::read<char>(&this->stream,(size_t)data.end);
  __beg = local_30;
  __end = data.begin;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((string *)__return_storage_ptr__,(char *)__beg,__end,&local_31);
  std::allocator<char>::~allocator(&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string Decoder::readString() {
        size_t size = stream.read<uint8_t>();
        auto data = stream.read<char>(size);
        return std::string(data.begin, data.end);
    }